

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIDMap.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNodeIDMap::DOMNodeIDMap(DOMNodeIDMap *this,XMLSize_t initialSize,DOMDocument *doc)

{
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  RuntimeException *this_00;
  XMLSize_t XVar3;
  XMLSize_t XVar4;
  ulong uVar5;
  
  this->fNumEntries = 0;
  this->fDoc = doc;
  if (initialSize < 0x3e6) {
    uVar5 = 0x3e5;
    XVar3 = 0;
  }
  else {
    XVar3 = 0;
    do {
      if (XVar3 == 6) {
        this->fSizeIndex = 5;
        this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
        RuntimeException::RuntimeException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeIDMap.cpp"
                   ,0x31,NodeIDMap_GrowErr,
                   (MemoryManager *)this->fDoc[10].super_DOMNode._vptr_DOMNode);
        __cxa_throw(this_00,&RuntimeException::typeinfo,XMLException::~XMLException);
      }
      uVar5 = *(ulong *)(gPrimes + XVar3 * 8 + 8);
      XVar3 = XVar3 + 1;
    } while (uVar5 < initialSize);
  }
  this->fSizeIndex = XVar3;
  this->fSize = uVar5;
  uVar2 = (ulong)((float)uVar5 * 0.8);
  this->fMaxEntries = (long)((float)uVar5 * 0.8 - 9.223372e+18) & (long)uVar2 >> 0x3f | uVar2;
  iVar1 = (*doc[-1].super_DOMNode._vptr_DOMNode[4])(&doc[-1].super_DOMNode,uVar5 << 3);
  this->fTable = (DOMAttr **)CONCAT44(extraout_var,iVar1);
  XVar3 = this->fSize;
  if (XVar3 != 0) {
    XVar4 = 0;
    do {
      this->fTable[XVar4] = (DOMAttr *)0x0;
      XVar4 = XVar4 + 1;
    } while (XVar3 != XVar4);
  }
  return;
}

Assistant:

DOMNodeIDMap::DOMNodeIDMap(XMLSize_t initialSize, DOMDocument *doc)
: fNumEntries(0)
, fDoc(doc)
{
    for (fSizeIndex = 0; gPrimes[fSizeIndex] < initialSize; fSizeIndex++)
    {
        if (gPrimes[fSizeIndex] == 0)
        {
            // We need a bigger size than the largest available one.
            //   Big trouble.
            fSizeIndex--;
            ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::NodeIDMap_GrowErr, ((DOMDocumentImpl *)fDoc)->getMemoryManager());
        }
    }

    fSize = gPrimes[fSizeIndex];
    fMaxEntries = (XMLSize_t)(float(fSize) * gMaxFill);

    //fTable = new (fDoc) DOMAttr*[fSize];
    fTable = (DOMAttr**) ((DOMDocumentImpl *)fDoc)->allocate(sizeof(DOMAttr*) * fSize);
    XMLSize_t i;
    for (i=0; i<fSize; i++)
        fTable[i] = 0;
}